

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config_test.cc
# Opt level: O0

bool anon_unknown.dwarf_65e8d::VerifyAv1c
               (uint8_t *obu_buffer,size_t obu_buffer_length,bool is_annexb)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AssertHelper *this;
  byte in_DL;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  bool parse_ok;
  Av1Config av1_config;
  bool local_2a1;
  AssertHelper *in_stack_fffffffffffffd60;
  int *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  Av1Config *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  Type type;
  AssertHelper *in_stack_fffffffffffffd90;
  uint8_t *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 uVar4;
  AssertHelper *in_stack_fffffffffffffde0;
  AssertionResult local_1f8 [2];
  undefined4 local_1d4;
  AssertionResult local_1d0 [2];
  undefined4 local_1ac;
  AssertionResult local_1a8 [2];
  undefined4 local_184;
  AssertionResult local_180 [2];
  undefined4 local_15c;
  AssertionResult local_158 [2];
  undefined4 local_134;
  AssertionResult local_130 [2];
  undefined4 local_10c;
  AssertionResult local_108 [2];
  undefined4 local_e4;
  AssertionResult local_e0 [2];
  undefined4 local_bc;
  AssertionResult local_b8 [2];
  undefined4 local_94;
  AssertionResult local_90 [2];
  undefined4 local_6c;
  AssertionResult local_68 [3];
  undefined4 local_34;
  AssertionResult local_30;
  byte local_1f;
  undefined1 local_1e [13];
  byte local_11;
  
  type = (Type)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_11 = in_DL & 1;
  memset(local_1e,0,0xd);
  iVar2 = get_av1config_from_obu
                    (in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90,type,
                     in_stack_fffffffffffffd80);
  local_1f = iVar2 == 0;
  if ((bool)local_1f) {
    local_34 = 1;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      testing::AssertionResult::failure_message((AssertionResult *)0x3b3bd6);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b3c33);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3ca1);
    local_6c = 1;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      testing::AssertionResult::failure_message((AssertionResult *)0x3b3d21);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b3d7e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3dec);
    local_94 = 0;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      testing::AssertionResult::failure_message((AssertionResult *)0x3b3e6c);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b3ec9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3f37);
    local_bc = 0;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      testing::AssertionResult::failure_message((AssertionResult *)0x3b3fb7);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b4014);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4082);
    local_e4 = 0;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      testing::AssertionResult::failure_message((AssertionResult *)0x3b4102);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b415f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b41cd);
    local_10c = 0;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      testing::AssertionResult::failure_message((AssertionResult *)0x3b424d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b42aa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4318);
    local_134 = 0;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      in_stack_fffffffffffffd90 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x3b4398);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b43f5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4463);
    local_15c = 0;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b44e3);
      type = (Type)((ulong)pcVar3 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b4540);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b45ae);
    local_184 = 1;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      in_stack_fffffffffffffd80 =
           (Av1Config *)testing::AssertionResult::failure_message((AssertionResult *)0x3b462e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b468b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b46f9);
    local_1ac = 1;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      in_stack_fffffffffffffd78 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3b4779);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b47d6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4844);
    local_1d4 = 0;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      in_stack_fffffffffffffd70 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3b48c4);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b4921);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b498f);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      in_stack_fffffffffffffd68 =
           (int *)testing::AssertionResult::failure_message((AssertionResult *)0x3b4a0f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd60);
      testing::Message::~Message((Message *)0x3b4a6c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4ada);
    uVar4 = 0;
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (uchar *)in_stack_fffffffffffffd60);
    iVar2 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffde0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd90);
      this = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x3b4b57);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd90,type,(char *)in_stack_fffffffffffffd80,iVar2,
                 in_stack_fffffffffffffd70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffde0,(Message *)CONCAT44(uVar4,in_stack_fffffffffffffdd8));
      testing::internal::AssertHelper::~AssertHelper(this);
      testing::Message::~Message((Message *)0x3b4ba5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4c0a);
  }
  local_2a1 = false;
  if ((local_1f & 1) != 0) {
    local_2a1 = testing::Test::HasFailure();
    local_2a1 = !local_2a1;
  }
  return local_2a1;
}

Assistant:

bool VerifyAv1c(const uint8_t *const obu_buffer, size_t obu_buffer_length,
                bool is_annexb) {
  Av1Config av1_config;
  memset(&av1_config, 0, sizeof(av1_config));
  bool parse_ok = get_av1config_from_obu(obu_buffer, obu_buffer_length,
                                         is_annexb, &av1_config) == 0;
  if (parse_ok) {
    EXPECT_EQ(1, av1_config.marker);
    EXPECT_EQ(1, av1_config.version);
    EXPECT_EQ(0, av1_config.seq_profile);
    EXPECT_EQ(0, av1_config.seq_level_idx_0);
    EXPECT_EQ(0, av1_config.seq_tier_0);
    EXPECT_EQ(0, av1_config.high_bitdepth);
    EXPECT_EQ(0, av1_config.twelve_bit);
    EXPECT_EQ(0, av1_config.monochrome);
    EXPECT_EQ(1, av1_config.chroma_subsampling_x);
    EXPECT_EQ(1, av1_config.chroma_subsampling_y);
    EXPECT_EQ(0, av1_config.chroma_sample_position);
    EXPECT_EQ(0, av1_config.initial_presentation_delay_present);
    EXPECT_EQ(0, av1_config.initial_presentation_delay_minus_one);
  }
  return parse_ok && ::testing::Test::HasFailure() == false;
}